

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonarray.cpp
# Opt level: O0

bool __thiscall QJsonArray::contains(QJsonArray *this,QJsonValue *value)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  qsizetype i;
  QJsonValue *in_stack_ffffffffffffff78;
  QJsonValue *in_stack_ffffffffffffff80;
  qsizetype in_stack_ffffffffffffffb0;
  QJsonArray *in_stack_ffffffffffffffb8;
  undefined8 local_40;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = 0;
  do {
    qVar3 = size((QJsonArray *)in_stack_ffffffffffffff80);
    if (qVar3 <= local_40) {
      local_21 = false;
LAB_0048751b:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return local_21;
      }
      __stack_chk_fail();
    }
    at(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    bVar2 = ::operator==(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    QJsonValue::~QJsonValue((QJsonValue *)0x4874d2);
    if (bVar2) {
      local_21 = true;
      goto LAB_0048751b;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

bool QJsonArray::contains(const QJsonValue &value) const
{
    for (qsizetype i = 0; i < size(); i++) {
        if (at(i) == value)
            return true;
    }
    return false;
}